

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall re2::Compiler::Quest(Compiler *this,Frag a,bool nongreedy)

{
  PatchList PVar1;
  PatchList PVar2;
  PatchList PVar3;
  PatchList PVar4;
  Inst *pIVar5;
  ulong uVar6;
  uint uVar7;
  Frag FVar8;
  uint local_50;
  uint32_t uStack_4c;
  uint32_t uStack_48;
  int iStack_44;
  uint32_t local_30;
  uint32_t uStack_2c;
  
  local_30 = a.begin;
  uStack_2c = a.end.head;
  if (local_30 == 0) {
    FVar8 = Nop(this);
    local_50 = FVar8.begin;
    uStack_4c = FVar8.end.head;
    uStack_48 = FVar8.end.tail;
    iStack_44 = CONCAT31(iStack_44._1_3_,FVar8.nullable);
  }
  else {
    local_50 = AllocInst(this,1);
    if ((int)local_50 < 0) {
      local_50 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      iStack_44 = (uint)iStack_44._1_3_ << 8;
    }
    else {
      pIVar5 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + local_50;
      uVar7 = local_50 * 2;
      if (nongreedy) {
        Prog::Inst::InitAlt(pIVar5,0,local_30);
      }
      else {
        Prog::Inst::InitAlt(pIVar5,local_30,0);
        uVar7 = uVar7 | 1;
      }
      PVar2 = (PatchList)((ulong)uVar7 * 0x100000001);
      PVar1 = a.end;
      PVar3 = PVar1;
      PVar4 = PVar1;
      if ((PVar2.head != 0) && (PVar3 = PVar2, PVar4 = PVar2, uStack_2c != 0)) {
        pIVar5 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        uVar6 = (ulong)uVar7 / 2;
        if (((ulong)PVar2 & 0x100000000) == 0) {
          pIVar5[uVar6].out_opcode_ = pIVar5[uVar6].out_opcode_ & 0xf | uStack_2c << 4;
          PVar4 = PVar1;
        }
        else {
          pIVar5[uVar6].field_1.out1_ = uStack_2c;
          PVar4 = PVar1;
        }
      }
      uStack_48 = PVar4.tail;
      uStack_4c = PVar3.head;
      iStack_44 = CONCAT31(iStack_44._1_3_,1);
    }
  }
  FVar8.end.head = uStack_4c;
  FVar8.begin = local_50;
  FVar8.end.tail = uStack_48;
  FVar8._12_4_ = iStack_44;
  return FVar8;
}

Assistant:

Frag Compiler::Quest(Frag a, bool nongreedy) {
  if (IsNoMatch(a))
    return Nop();
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  return Frag(id, PatchList::Append(inst_.data(), pl, a.end), true);
}